

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignable_var_conversion.cpp
# Opt level: O3

void skiwi::assignable_variable_conversion(Program *prog,compiler_options *ops)

{
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *__v;
  pointer pvVar1;
  pointer pfVar2;
  pointer pcVar3;
  uint uVar4;
  long lVar5;
  pointer pfVar6;
  pointer pcVar7;
  variant_alternative_t<0UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar8;
  pointer pfVar9;
  pointer pcVar10;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  pointer pvVar11;
  ulong uVar12;
  Expressions *__range3;
  thread *t;
  ulong uVar13;
  size_t i;
  convert_assignable_variables cav;
  unsigned_long n_threads;
  find_assignable_variables fav;
  unsigned_long n_lacking_tasks;
  unsigned_long n_max_tasks_per_thread;
  value_type local_e8;
  thread local_d0;
  convert_assignable_variables local_c8;
  ulong local_90;
  find_assignable_variables local_88;
  Program *local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  if (prog->alpha_converted == false) {
    __assert_fail("prog.alpha_converted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/assignable_var_conversion.cpp"
                  ,0x1b8,
                  "void skiwi::assignable_variable_conversion(Program &, const compiler_options &)")
    ;
  }
  __v = (prog->expressions).
        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(prog->expressions).
                super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__v;
  if ((ulong)((lVar5 >> 4) * -0x1111111111111111) < 2) {
    if (lVar5 == 0xf0) {
      if ((__v->
          super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          ).
          super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          .
          super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          .
          super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          .
          super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          .
          super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          ._M_index == '\0') {
        pvVar8 = std::
                 get<0ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                           (__v);
        pvVar11 = (pvVar8->arguments).
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = (pvVar8->arguments).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar5 = (long)pvVar1 - (long)pvVar11 >> 4;
        uVar13 = lVar5 * -0x1111111111111111;
        local_38 = 0;
        local_e8.p_expr = (Expression *)pvVar8;
        if (ops->parallel == false) {
          if (pvVar1 != pvVar11) {
            i = 0;
            do {
              assignable_variable_conversion::anon_class_8_1_ba1d37e4::operator()
                        ((anon_class_8_1_ba1d37e4 *)
                         (pvVar8->arguments).
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,i);
              i = i + 1;
            } while (uVar13 - i != 0);
          }
        }
        else {
          local_50 = prog;
          uVar4 = std::thread::hardware_concurrency();
          local_90 = (ulong)uVar4;
          uVar12 = 0;
          local_40 = (uVar13 / local_90 + 1) - (ulong)(uVar13 % local_90 == 0);
          local_48 = local_40 * local_90 + lVar5 * 0x1111111111111111;
          local_88.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          do {
            local_d0._M_id._M_thread = (id)0;
            local_c8.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
            *(undefined ***)
             &(((pointer)
               local_c8.env.
               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              ).
              super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              .
              super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              .
              super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              .
              super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              .
              super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              ._M_u = &PTR___State_002a0db8;
            *(ulong *)((long)&(((pointer)
                               local_c8.env.
                               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ).
                              super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ._M_u + 8) = uVar12;
            *(ulong **)
             ((long)&(((pointer)
                      local_c8.env.
                      super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ).
                     super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ._M_u + 0x10) = &local_90;
            *(long **)((long)&(((pointer)
                               local_c8.env.
                               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ).
                              super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ._M_u + 0x18) = &local_48;
            *(long **)((long)&(((pointer)
                               local_c8.env.
                               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ).
                              super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              .
                              super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              ._M_u + 0x20) = &local_40;
            *(value_type **)
             ((long)&(((pointer)
                      local_c8.env.
                      super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ).
                     super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ._M_u + 0x28) = &local_e8;
            *(undefined8 **)
             ((long)&(((pointer)
                      local_c8.env.
                      super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ).
                     super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     .
                     super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     ._M_u + 0x30) = &local_38;
            std::thread::_M_start_thread(&local_d0,&local_c8,0);
            if ((pointer)local_c8.env.
                         super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(*(long *)&(((_Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                        *)&(local_c8.env.
                                            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>
                                      )->
                                     super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                     ).
                                     super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                     .
                                     super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                     .
                                     super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                     .
                                     super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                     ._M_u + 8))();
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                      ((vector<std::thread,_std::allocator<std::thread>_> *)&local_88,&local_d0);
            prog = local_50;
            pfVar2 = local_88.expressions.
                     super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (local_d0._M_id._M_thread != 0) {
              std::terminate();
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_90);
          local_d0._M_id._M_thread = (id)0;
          for (pfVar9 = local_88.expressions.
                        super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                        ._M_impl.super__Vector_impl_data._M_start; pfVar9 != pfVar2;
              pfVar9 = (pointer)&pfVar9->state) {
            std::thread::join();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                    ((vector<std::thread,_std::allocator<std::thread>_> *)&local_88);
        }
      }
      else {
        anon_unknown_26::find_assignable_variables::find_assignable_variables(&local_88);
        pvVar11 = (prog->expressions).
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = (prog->expressions).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar11 != pvVar1) {
          do {
            local_c8.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)local_c8.env.
                                  super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
            local_c8.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pvVar11;
            std::
            vector<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ::push_back(&local_88.expressions,(value_type *)&local_c8);
            pvVar11 = pvVar11 + 1;
          } while (pvVar11 != pvVar1);
        }
        pfVar9 = local_88.expressions.
                 super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        pfVar2 = local_88.expressions.
                 super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_88.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start < pfVar9 &&
            local_88.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_88.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pfVar6 = pfVar2 + 1;
            local_c8.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar2->p_expr;
            local_c8.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pfVar2->state;
            pfVar2->state = pfVar9->state;
            pfVar2->p_expr = pfVar9->p_expr;
            pfVar9->p_expr =
                 (Expression *)
                 local_c8.env.
                 super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pfVar9->state =
                 (e_fav_state)
                 local_c8.env.
                 super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            pfVar9 = pfVar9 + -1;
            pfVar2 = pfVar6;
          } while (pfVar6 < pfVar9);
        }
        anon_unknown_26::find_assignable_variables::treat_expressions(&local_88);
        anon_unknown_26::convert_assignable_variables::convert_assignable_variables(&local_c8);
        pvVar11 = (prog->expressions).
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = (prog->expressions).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar11 != pvVar1) {
          do {
            local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
            local_e8.p_expr = pvVar11;
            std::
            vector<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ::push_back(&local_c8.expressions,&local_e8);
            pvVar11 = pvVar11 + 1;
          } while (pvVar11 != pvVar1);
        }
        pcVar10 = local_c8.expressions.
                  super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        pcVar3 = local_c8.expressions.
                 super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_c8.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start < pcVar10 &&
            local_c8.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_c8.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pcVar7 = pcVar3 + 1;
            local_e8.p_expr = pcVar3->p_expr;
            local_e8._8_8_ = *(undefined8 *)&pcVar3->state;
            pcVar3->state = pcVar10->state;
            pcVar3->p_expr = pcVar10->p_expr;
            pcVar10->p_expr = local_e8.p_expr;
            pcVar10->state = local_e8.state;
            pcVar10 = pcVar10 + -1;
            pcVar3 = pcVar7;
          } while (pcVar7 < pcVar10);
        }
        anon_unknown_26::convert_assignable_variables::treat_expressions(&local_c8);
        if (local_c8.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.expressions.
                          super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.expressions.
                                super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.expressions.
                                super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
        ::~vector(&local_c8.env);
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_88.assignable_variables);
        if (local_88.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.expressions.
                          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.expressions.
                                super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.expressions.
                                super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    prog->assignable_variables_converted = true;
    return;
  }
  __assert_fail("prog.expressions.size() <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/assignable_var_conversion.cpp"
                ,0x1b9,
                "void skiwi::assignable_variable_conversion(Program &, const compiler_options &)");
}

Assistant:

void assignable_variable_conversion(Program& prog, const compiler_options& ops)
  {
  /*
  assert(prog.alpha_converted);
  find_assignable_variables fav;
  visitor<Program, find_assignable_variables>::visit(prog, &fav);
  convert_assignable_variables cav;
  //for (const auto& v : fav.assignable_variables)
  //  cav.env->push(v, true);
  visitor<Program, convert_assignable_variables>::visit(prog, &cav);
  prog.assignable_variables_converted = true;
  */
  assert(prog.alpha_converted);
  assert(prog.expressions.size() <= 1);

  if (prog.expressions.size() == 1)
    {
    Expression& e = prog.expressions.front();
    if (std::holds_alternative<Begin>(e))
      {
      Begin& beg = std::get<Begin>(e);
      size_t sz = beg.arguments.size();
      parallel_for(size_t(0), sz, [&](size_t i)
        {
        auto& arg = beg.arguments[i];
        find_assignable_variables fav;
        fav.expressions.push_back(&arg);
        fav.treat_expressions();
        convert_assignable_variables cav;
        cav.expressions.push_back(&arg);
        cav.treat_expressions();
        }, ops);
      }
    else
      {
      find_assignable_variables fav;
      for (auto& expr : prog.expressions)
        fav.expressions.push_back(&expr);
      std::reverse(fav.expressions.begin(), fav.expressions.end());
      fav.treat_expressions();
      convert_assignable_variables cav;
      for (auto& expr : prog.expressions)
        cav.expressions.push_back(&expr);
      std::reverse(cav.expressions.begin(), cav.expressions.end());
      cav.treat_expressions();
      }
    }
  prog.assignable_variables_converted = true;
  }